

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceLoader.cpp
# Opt level: O0

LoadResult * __thiscall
slang::driver::SourceLoader::loadAndParse
          (SourceLoader *this,FileEntry *entry,Bag *optionBag,SourceOptions *srcOptions,
          uint64_t fileSortKey)

{
  MacroList inheritedMacros;
  undefined1 uVar1;
  bool bVar2;
  error_type *__y;
  value_type *pvVar3;
  element_type *peVar4;
  FileEntry *in_RDX;
  SourceBuffer *in_RSI;
  SourceManager *in_RDI;
  long in_R8;
  shared_ptr<slang::syntax::SyntaxTree> tree;
  BufferOrError buffer;
  pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>
  *in_stack_fffffffffffffe18;
  variant<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
  *in_stack_fffffffffffffe20;
  expected<slang::SourceBuffer,_std::error_code> *in_stack_fffffffffffffe30;
  uint64_t in_stack_fffffffffffffe40;
  SourceLibrary *in_stack_fffffffffffffe48;
  path *in_stack_fffffffffffffe50;
  SourceManager *sourceManager;
  undefined7 in_stack_fffffffffffffe70;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe78;
  bool local_161;
  pair<slang::SourceBuffer,_bool> local_160;
  bool local_131;
  pair<slang::SourceBuffer,_bool> local_130;
  pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*> local_108;
  undefined4 local_dc;
  FileEntry *local_d8;
  pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code> local_d0 [7];
  long local_28;
  FileEntry *local_18;
  
  sourceManager = in_RDI;
  local_28 = in_R8;
  local_18 = in_RDX;
  nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::expected<true,_0>
            (in_stack_fffffffffffffe30);
  uVar1 = SourceBuffer::operator_cast_to_bool((SourceBuffer *)0xb7f46f);
  if ((bool)uVar1) {
    nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::
    expected<slang::SourceBuffer,_0>
              ((expected<slang::SourceBuffer,_std::error_code> *)in_stack_fffffffffffffe20,
               &in_stack_fffffffffffffe18->first);
    nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::operator=
              ((expected<slang::SourceBuffer,_std::error_code> *)in_stack_fffffffffffffe50,
               (expected<slang::SourceBuffer,_std::error_code> *)in_stack_fffffffffffffe48);
    nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::~expected
              ((expected<slang::SourceBuffer,_std::error_code> *)in_stack_fffffffffffffe20);
  }
  else {
    SourceManager::readSource
              (in_RDI,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40)
    ;
    nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::operator=
              ((expected<slang::SourceBuffer,_std::error_code> *)in_stack_fffffffffffffe50,
               (expected<slang::SourceBuffer,_std::error_code> *)in_stack_fffffffffffffe48);
    nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::~expected
              ((expected<slang::SourceBuffer,_std::error_code> *)in_stack_fffffffffffffe20);
  }
  bVar2 = nonstd::expected_lite::expected::operator_cast_to_bool
                    ((expected<slang::SourceBuffer,_std::error_code> *)0xb7f53e);
  if (bVar2) {
    if (local_18->unit == (UnitEntry *)0x0) {
      if (((local_18->isLibraryFile & 1U) == 0) && ((*(byte *)(local_28 + 8) & 1) != 0)) {
        pvVar3 = nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::operator*
                           ((expected<slang::SourceBuffer,_std::error_code> *)0xb7f632);
        local_131 = false;
        std::pair<slang::SourceBuffer,_bool>::pair<slang::SourceBuffer_&,_bool,_true>
                  (&local_130,pvVar3,&local_131);
        std::
        variant<std::shared_ptr<slang::syntax::SyntaxTree>,std::pair<slang::SourceBuffer,bool>,std::pair<slang::driver::SourceLoader::FileEntry_const*,std::error_code>,std::pair<slang::SourceBuffer,slang::driver::SourceLoader::UnitEntry_const*>>
        ::
        variant<std::pair<slang::SourceBuffer,bool>,void,void,std::pair<slang::SourceBuffer,bool>,void>
                  (in_stack_fffffffffffffe20,
                   (pair<slang::SourceBuffer,_bool> *)in_stack_fffffffffffffe18);
        local_dc = 1;
      }
      else if ((*(byte *)(local_28 + 10) & 1) == 0) {
        nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::operator*
                  ((expected<slang::SourceBuffer,_std::error_code> *)0xb7f6fa);
        in_stack_fffffffffffffe20 =
             (variant<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<slang::SourceBuffer,_bool>,_std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>,_std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>_>
              *)(in_RSI->data)._M_len;
        std::span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>::span
                  ((span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>
                    *)0xb7f725);
        inheritedMacros._M_ptr._7_1_ = uVar1;
        inheritedMacros._M_ptr._0_7_ = in_stack_fffffffffffffe70;
        inheritedMacros._M_extent._M_extent_value = in_stack_fffffffffffffe78._M_extent_value;
        slang::syntax::SyntaxTree::fromBuffer(in_RSI,sourceManager,(Bag *)in_RDI,inheritedMacros);
        if (((local_18->isLibraryFile & 1U) != 0) || ((*(byte *)(local_28 + 9) & 1) != 0)) {
          peVar4 = std::
                   __shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0xb7f770);
          peVar4->isLibraryUnit = true;
        }
        std::
        variant<std::shared_ptr<slang::syntax::SyntaxTree>,std::pair<slang::SourceBuffer,bool>,std::pair<slang::driver::SourceLoader::FileEntry_const*,std::error_code>,std::pair<slang::SourceBuffer,slang::driver::SourceLoader::UnitEntry_const*>>
        ::
        variant<std::shared_ptr<slang::syntax::SyntaxTree>,void,void,std::shared_ptr<slang::syntax::SyntaxTree>,void>
                  (in_stack_fffffffffffffe20,
                   (shared_ptr<slang::syntax::SyntaxTree> *)in_stack_fffffffffffffe18);
        local_dc = 1;
        std::shared_ptr<slang::syntax::SyntaxTree>::~shared_ptr
                  ((shared_ptr<slang::syntax::SyntaxTree> *)0xb7f797);
      }
      else {
        pvVar3 = nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::operator*
                           ((expected<slang::SourceBuffer,_std::error_code> *)0xb7f6a0);
        local_161 = true;
        std::pair<slang::SourceBuffer,_bool>::pair<slang::SourceBuffer_&,_bool,_true>
                  (&local_160,pvVar3,&local_161);
        std::
        variant<std::shared_ptr<slang::syntax::SyntaxTree>,std::pair<slang::SourceBuffer,bool>,std::pair<slang::driver::SourceLoader::FileEntry_const*,std::error_code>,std::pair<slang::SourceBuffer,slang::driver::SourceLoader::UnitEntry_const*>>
        ::
        variant<std::pair<slang::SourceBuffer,bool>,void,void,std::pair<slang::SourceBuffer,bool>,void>
                  (in_stack_fffffffffffffe20,
                   (pair<slang::SourceBuffer,_bool> *)in_stack_fffffffffffffe18);
        local_dc = 1;
      }
    }
    else {
      pvVar3 = nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::operator*
                         ((expected<slang::SourceBuffer,_std::error_code> *)0xb7f5c0);
      std::pair<slang::SourceBuffer,_const_slang::driver::SourceLoader::UnitEntry_*>::
      pair<slang::SourceBuffer_&,_true>(&local_108,pvVar3,&local_18->unit);
      std::
      variant<std::shared_ptr<slang::syntax::SyntaxTree>,std::pair<slang::SourceBuffer,bool>,std::pair<slang::driver::SourceLoader::FileEntry_const*,std::error_code>,std::pair<slang::SourceBuffer,slang::driver::SourceLoader::UnitEntry_const*>>
      ::
      variant<std::pair<slang::SourceBuffer,slang::driver::SourceLoader::UnitEntry_const*>,void,void,std::pair<slang::SourceBuffer,slang::driver::SourceLoader::UnitEntry_const*>,void>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      local_dc = 1;
    }
  }
  else {
    local_d8 = local_18;
    __y = nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::error
                    ((expected<slang::SourceBuffer,_std::error_code> *)0xb7f55f);
    std::pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code>::
    pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code_&,_true>
              (local_d0,&local_d8,__y);
    std::
    variant<std::shared_ptr<slang::syntax::SyntaxTree>,std::pair<slang::SourceBuffer,bool>,std::pair<slang::driver::SourceLoader::FileEntry_const*,std::error_code>,std::pair<slang::SourceBuffer,slang::driver::SourceLoader::UnitEntry_const*>>
    ::
    variant<std::pair<slang::driver::SourceLoader::FileEntry_const*,std::error_code>,void,void,std::pair<slang::driver::SourceLoader::FileEntry_const*,std::error_code>,void>
              (in_stack_fffffffffffffe20,
               (pair<const_slang::driver::SourceLoader::FileEntry_*,_std::error_code> *)
               in_stack_fffffffffffffe18);
    local_dc = 1;
  }
  nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::~expected
            ((expected<slang::SourceBuffer,_std::error_code> *)in_stack_fffffffffffffe20);
  return (LoadResult *)sourceManager;
}

Assistant:

SourceLoader::LoadResult SourceLoader::loadAndParse(const FileEntry& entry, const Bag& optionBag,
                                                    const SourceOptions& srcOptions,
                                                    uint64_t fileSortKey) {
    // TODO: error if secondLib is set

    SourceManager::BufferOrError buffer;
    if (entry.preloadedBuffer)
        buffer = entry.preloadedBuffer;
    else
        buffer = sourceManager.readSource(entry.path, entry.library, fileSortKey);

    if (!buffer)
        return std::pair{&entry, buffer.error()};

    if (entry.unit) {
        return std::pair{*buffer, entry.unit};
    }
    else if (!entry.isLibraryFile && srcOptions.singleUnit) {
        // If this file was directly specified (i.e. not via
        // a library mapping) and we're in single-unit mode,
        // collect it for later parsing.
        return std::pair{*buffer, false};
    }
    else if (srcOptions.librariesInheritMacros) {
        // If libraries inherit macros then we can't parse here,
        // we need to wait for the main compilation unit to be parsed.
        SLANG_ASSERT(entry.isLibraryFile);
        return std::pair{*buffer, true};
    }
    else {
        // Otherwise we can parse right away.
        auto tree = SyntaxTree::fromBuffer(*buffer, sourceManager, optionBag);
        if (entry.isLibraryFile || srcOptions.onlyLint)
            tree->isLibraryUnit = true;

        return tree;
    }
}